

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O3

int Gia_Rsb2ManDivs(Gia_Rsb2Man_t *p,int iNode)

{
  Vec_Int_t *p_00;
  long lVar1;
  uint uVar2;
  int *piVar3;
  word *pwVar4;
  int iVar5;
  int iVar6;
  word wVar7;
  void **ppvVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  void *pvVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int local_5c;
  
  piVar3 = (p->vRefs).pArray;
  wVar7 = Gia_Rsb2ManOdcs(p,iNode);
  p->CareSet = wVar7;
  if ((iNode < 0) || ((p->vSims).nSize <= iNode * 2)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                  ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
  }
  uVar9 = (p->vSims).pArray[(uint)(iNode * 2)] & wVar7;
  p->Truth1 = uVar9;
  p->Truth0 = uVar9 ^ wVar7;
  (p->vpDivs).nSize = 0;
  iVar5 = (p->vpDivs).nCap;
  ppvVar8 = (p->vpDivs).pArray;
  if (iVar5 == 0) {
    if (ppvVar8 == (void **)0x0) {
      ppvVar8 = (void **)malloc(0x80);
      iVar5 = 0;
    }
    else {
      ppvVar8 = (void **)realloc(ppvVar8,0x80);
      iVar5 = (p->vpDivs).nSize;
    }
    (p->vpDivs).pArray = ppvVar8;
    (p->vpDivs).nCap = 0x10;
    (p->vpDivs).nSize = iVar5 + 1;
    ppvVar8[iVar5] = &p->Truth0;
    if (iVar5 + 1 == 0x10) {
      ppvVar8 = (p->vpDivs).pArray;
      if (ppvVar8 == (void **)0x0) {
        ppvVar8 = (void **)malloc(0x100);
      }
      else {
        ppvVar8 = (void **)realloc(ppvVar8,0x100);
      }
      (p->vpDivs).pArray = ppvVar8;
      (p->vpDivs).nCap = 0x20;
      goto LAB_007aca87;
    }
  }
  else {
    (p->vpDivs).nSize = 1;
    *ppvVar8 = &p->Truth0;
    if (iVar5 == 1) {
      ppvVar8 = (p->vpDivs).pArray;
      if (ppvVar8 == (void **)0x0) {
        ppvVar8 = (void **)malloc(0x80);
      }
      else {
        ppvVar8 = (void **)realloc(ppvVar8,0x80);
      }
      (p->vpDivs).pArray = ppvVar8;
      (p->vpDivs).nCap = 0x10;
      goto LAB_007aca87;
    }
  }
  ppvVar8 = (p->vpDivs).pArray;
LAB_007aca87:
  iVar5 = (p->vpDivs).nSize;
  (p->vpDivs).nSize = iVar5 + 1;
  ppvVar8[iVar5] = &p->Truth1;
  p_00 = &p->vDivs;
  (p->vDivs).nSize = 0;
  Vec_IntPush(p_00,-1);
  Vec_IntPush(p_00,-1);
  if (0 < p->nPis) {
    lVar15 = 0x10;
    lVar13 = 0;
    lVar10 = 0;
    do {
      lVar13 = lVar13 + 2;
      if ((p->vSims).nSize <= lVar13) goto LAB_007acd6c;
      pvVar12 = (void *)((long)(p->vSims).pArray + lVar15);
      uVar2 = (p->vpDivs).nSize;
      if (uVar2 == (p->vpDivs).nCap) {
        if ((int)uVar2 < 0x10) {
          ppvVar8 = (p->vpDivs).pArray;
          if (ppvVar8 == (void **)0x0) {
            ppvVar8 = (void **)malloc(0x80);
          }
          else {
            ppvVar8 = (void **)realloc(ppvVar8,0x80);
          }
          (p->vpDivs).pArray = ppvVar8;
          (p->vpDivs).nCap = 0x10;
        }
        else {
          ppvVar8 = (p->vpDivs).pArray;
          if (ppvVar8 == (void **)0x0) {
            ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar8 = (void **)realloc(ppvVar8,(ulong)uVar2 << 4);
          }
          (p->vpDivs).pArray = ppvVar8;
          (p->vpDivs).nCap = uVar2 * 2;
        }
      }
      else {
        ppvVar8 = (p->vpDivs).pArray;
      }
      lVar14 = lVar10 + 1;
      lVar15 = lVar15 + 0x10;
      iVar5 = (p->vpDivs).nSize;
      (p->vpDivs).nSize = iVar5 + 1;
      ppvVar8[iVar5] = pvVar12;
      Vec_IntPush(p_00,(int)lVar10 + 1);
      lVar10 = lVar14;
    } while (lVar14 < p->nPis);
  }
  iVar5 = Gia_Rsb2ManMffc(p,iNode);
  p->nMffc = iVar5;
  if (p->nLevelIncrease < 0) {
    local_5c = 0;
  }
  else {
    iVar5 = Gia_Rsb2ManLevel(p);
    p->Level = iVar5;
    if ((p->vLevels).nSize <= iNode) {
LAB_007acd8b:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    local_5c = (p->vLevels).pArray[(uint)iNode];
  }
  iVar5 = p->nPis;
  lVar10 = (long)iVar5;
  iVar6 = p->iFirstPo;
  if (iVar5 + 1 < iVar6) {
    lVar13 = lVar10 + 1;
    lVar15 = lVar10 * 2;
    lVar14 = lVar10 << 4;
    lVar16 = 0;
    do {
      lVar15 = lVar15 + 2;
      lVar14 = lVar14 + 0x10;
      if (piVar3[lVar10 + lVar16 + 1] != 0) {
        iVar11 = iVar5 + (int)lVar16;
        if (p->nLevelIncrease < 0) {
          if (iVar11 < -1) {
LAB_007acd6c:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                          ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
          }
        }
        else {
          if ((iVar11 < -1) || ((long)(p->vLevels).nSize <= lVar13 + lVar16)) goto LAB_007acd8b;
          if (p->nLevelIncrease + local_5c < (p->vLevels).pArray[lVar10 + lVar16 + 1])
          goto LAB_007acd37;
        }
        if ((p->vSims).nSize <= lVar15) goto LAB_007acd6c;
        pwVar4 = (p->vSims).pArray;
        uVar2 = (p->vpDivs).nSize;
        if (uVar2 == (p->vpDivs).nCap) {
          if ((int)uVar2 < 0x10) {
            ppvVar8 = (p->vpDivs).pArray;
            if (ppvVar8 == (void **)0x0) {
              ppvVar8 = (void **)malloc(0x80);
            }
            else {
              ppvVar8 = (void **)realloc(ppvVar8,0x80);
            }
            (p->vpDivs).pArray = ppvVar8;
            (p->vpDivs).nCap = 0x10;
          }
          else {
            ppvVar8 = (p->vpDivs).pArray;
            if (ppvVar8 == (void **)0x0) {
              ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar8 = (void **)realloc(ppvVar8,(ulong)uVar2 << 4);
            }
            (p->vpDivs).pArray = ppvVar8;
            (p->vpDivs).nCap = uVar2 * 2;
          }
        }
        else {
          ppvVar8 = (p->vpDivs).pArray;
        }
        iVar6 = (p->vpDivs).nSize;
        (p->vpDivs).nSize = iVar6 + 1;
        ppvVar8[iVar6] = (void *)((long)pwVar4 + lVar14);
        Vec_IntPush(p_00,(int)lVar13 + (int)lVar16);
        iVar6 = p->iFirstPo;
      }
LAB_007acd37:
      lVar1 = lVar13 + lVar16;
      lVar16 = lVar16 + 1;
    } while (lVar1 + 1 < (long)iVar6);
  }
  iVar5 = (p->vDivs).nSize;
  if (iVar5 != (p->vpDivs).nSize) {
    __assert_fail("Vec_IntSize(&p->vDivs) == Vec_PtrSize(&p->vpDivs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                  ,0x11e,"int Gia_Rsb2ManDivs(Gia_Rsb2Man_t *, int)");
  }
  return iVar5;
}

Assistant:

int Gia_Rsb2ManDivs( Gia_Rsb2Man_t * p, int iNode )
{
    int i, iNodeLevel = 0;
    int * pRefs = Vec_IntArray( &p->vRefs );
    p->CareSet = Gia_Rsb2ManOdcs( p, iNode );
    p->Truth1 = p->CareSet & Vec_WrdEntry(&p->vSims, 2*iNode);
    p->Truth0 = p->CareSet & ~p->Truth1;
    Vec_PtrClear( &p->vpDivs );
    Vec_PtrPush( &p->vpDivs, &p->Truth0 );
    Vec_PtrPush( &p->vpDivs, &p->Truth1 );
    Vec_IntClear( &p->vDivs );
    Vec_IntPushTwo( &p->vDivs, -1, -1 );
    for ( i = 1; i <= p->nPis; i++ )
    {
        Vec_PtrPush( &p->vpDivs, Vec_WrdEntryP(&p->vSims, 2*i) );
        Vec_IntPush( &p->vDivs, i );
    }
    p->nMffc = Gia_Rsb2ManMffc( p, iNode );
    if ( p->nLevelIncrease >= 0 )
    {
        p->Level = Gia_Rsb2ManLevel(p);
        iNodeLevel = Vec_IntEntry(&p->vLevels, iNode);
    }
    for ( i = p->nPis + 1; i < p->iFirstPo; i++ )
    {
        if ( !pRefs[i] || (p->nLevelIncrease >= 0 && Vec_IntEntry(&p->vLevels, i) > iNodeLevel + p->nLevelIncrease) )
            continue;
        Vec_PtrPush( &p->vpDivs, Vec_WrdEntryP(&p->vSims, 2*i) );
        Vec_IntPush( &p->vDivs, i );
    }
    assert( Vec_IntSize(&p->vDivs) == Vec_PtrSize(&p->vpDivs) );
    return Vec_IntSize(&p->vDivs);
}